

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathSubstringBeforeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  uint uVar1;
  xmlXPathObjectPtr pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlChar *pxVar4;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr *ppxVar5;
  uint uVar6;
  ulong uVar7;
  int code;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 2) {
    code = 0xc;
LAB_001bfa9e:
    xmlXPathErr(ctxt,code);
    return;
  }
  uVar6 = ctxt->valueNr;
  if ((int)uVar6 < 2) {
    code = 0x17;
    goto LAB_001bfa9e;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type == XPATH_STRING)) {
    uVar1 = uVar6 - 1;
    ctxt->valueNr = uVar1;
    ppxVar5 = ctxt->valueTab;
LAB_001bfac0:
    uVar7 = (ulong)uVar1;
    pxVar3 = ppxVar5[(ulong)uVar6 - 2];
  }
  else {
    xmlXPathStringFunction(ctxt,1);
    uVar6 = ctxt->valueNr;
    uVar7 = 0;
    if ((int)uVar6 < 1) {
      pxVar3 = (xmlXPathObjectPtr)0x0;
      goto LAB_001bfadd;
    }
    uVar1 = uVar6 - 1;
    ctxt->valueNr = uVar1;
    ppxVar5 = ctxt->valueTab;
    if (uVar6 != 1) goto LAB_001bfac0;
    pxVar3 = (xmlXPathObjectPtr)0x0;
  }
  ctxt->value = pxVar3;
  uVar6 = (uint)uVar7;
  pxVar3 = ppxVar5[uVar7];
  ppxVar5[uVar7] = (xmlXPathObjectPtr)0x0;
LAB_001bfadd:
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
    uVar6 = ctxt->valueNr;
  }
  if ((int)uVar6 < 1) {
    pxVar2 = (xmlXPathObjectPtr)0x0;
  }
  else {
    uVar1 = uVar6 - 1;
    ctxt->valueNr = uVar1;
    ppxVar5 = ctxt->valueTab;
    if (uVar6 == 1) {
      pxVar2 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar2 = ppxVar5[(ulong)uVar6 - 2];
    }
    ctxt->value = pxVar2;
    pxVar2 = ppxVar5[uVar1];
    ppxVar5[uVar1] = (xmlXPathObjectPtr)0x0;
  }
  if (ctxt->error == 0) {
    pxVar4 = xmlStrstr(pxVar2->stringval,pxVar3->stringval);
    if (pxVar4 == (xmlChar *)0x0) {
      pxVar4 = xmlStrdup("");
    }
    else {
      pxVar4 = xmlStrndup(pxVar2->stringval,(int)pxVar4 - (int)pxVar2->stringval);
    }
    if (pxVar4 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    else {
      value = xmlXPathCacheWrapString(ctxt,pxVar4);
      xmlXPathValuePush(ctxt,value);
    }
  }
  xmlXPathReleaseObject(ctxt->context,pxVar2);
  xmlXPathReleaseObject(ctxt->context,pxVar3);
  return;
}

Assistant:

void
xmlXPathSubstringBeforeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr find = NULL;
    const xmlChar *point;
    xmlChar *result;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    find = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    str = xmlXPathValuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    point = xmlStrstr(str->stringval, find->stringval);
    if (point == NULL) {
        result = xmlStrdup(BAD_CAST "");
    } else {
        result = xmlStrndup(str->stringval, point - str->stringval);
    }
    if (result == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }
    xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, result));

error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, find);
}